

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

void __thiscall libchars::terminal_driver::terminal_driver(terminal_driver *this)

{
  terminal_driver *this_local;
  
  this->T_must_return_ms = 0;
  this->is_tty = true;
  this->fd_r = -1;
  this->fd_w = -1;
  this->changed = false;
  this->size_initialized = false;
  this->size_not_accurate = false;
  this->control_enabled = false;
  this->t_cols = 0;
  this->t_rows = 0;
  this->pos_x = 0;
  this->pos_y = 0;
  this->rbuf = (uint8_t *)0x0;
  this->rbuf_size_log2 = 0;
  this->rbuf_size = 0;
  this->rbuf_enq = 0;
  this->rbuf_deq = 0;
  (this->T_ws_updated).tv_sec = 0;
  (this->T_ws_updated).tv_usec = 0;
  reallocate(this,10);
  return;
}

Assistant:

terminal_driver::terminal_driver() :
        T_must_return_ms(0),
        is_tty(true),
        fd_r(-1),fd_w(-1),
        changed(false),
        size_initialized(false),
        size_not_accurate(false),
        control_enabled(false),
        t_cols(0),t_rows(0),
        pos_x(0),pos_y(0),
        rbuf(NULL),
        rbuf_size_log2(0),rbuf_size(0),
        rbuf_enq(0),rbuf_deq(0)
    {
        T_ws_updated.tv_sec = 0;
        T_ws_updated.tv_usec = 0;
        reallocate(10);
    }